

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void mbedtls_xor(uchar *r,uchar *a,uchar *b,size_t n)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t x;
  size_t i;
  size_t n_local;
  uchar *b_local;
  uchar *a_local;
  uchar *r_local;
  
  for (x = 0; x + 8 <= n; x = x + 8) {
    uVar1 = mbedtls_get_unaligned_uint64(a + x);
    uVar2 = mbedtls_get_unaligned_uint64(b + x);
    mbedtls_put_unaligned_uint64(r + x,uVar1 ^ uVar2);
  }
  for (; x < n; x = x + 1) {
    r[x] = a[x] ^ b[x];
  }
  return;
}

Assistant:

inline void mbedtls_xor(unsigned char *r, const unsigned char *a, const unsigned char *b, size_t n)
{
    size_t i = 0;
#if defined(MBEDTLS_EFFICIENT_UNALIGNED_ACCESS)
#if defined(__ARM_NEON)
    for (; (i + 16) <= n; i += 16) {
        uint8x16_t v1 = vld1q_u8(a + i);
        uint8x16_t v2 = vld1q_u8(b + i);
        uint8x16_t x = veorq_u8(v1, v2);
        vst1q_u8(r + i, x);
    }
#elif defined(__amd64__) || defined(__x86_64__) || defined(__aarch64__)
    /* This codepath probably only makes sense on architectures with 64-bit registers */
    for (; (i + 8) <= n; i += 8) {
        uint64_t x = mbedtls_get_unaligned_uint64(a + i) ^ mbedtls_get_unaligned_uint64(b + i);
        mbedtls_put_unaligned_uint64(r + i, x);
    }
#else
    for (; (i + 4) <= n; i += 4) {
        uint32_t x = mbedtls_get_unaligned_uint32(a + i) ^ mbedtls_get_unaligned_uint32(b + i);
        mbedtls_put_unaligned_uint32(r + i, x);
    }
#endif
#endif
    for (; i < n; i++) {
        r[i] = a[i] ^ b[i];
    }
}